

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O3

void __thiscall ON_MD5::AccumulateBytes(ON_MD5 *this,void *buffer,ON__UINT64 sizeof_buffer)

{
  ON__UINT64 OVar1;
  
  if (sizeof_buffer == 0 || buffer == (void *)0x0) {
    return;
  }
  if ((this->m_status_bits & 1) == 0) {
    this->m_bit_count[0] = 0;
    this->m_bit_count[1] = 0;
    this->m_state[0] = 0x67452301;
    this->m_state[1] = 0xefcdab89;
    this->m_state[2] = 0x98badcfe;
    this->m_state[3] = 0x10325476;
    OVar1 = 0;
  }
  else {
    OVar1 = this->m_byte_count;
  }
  this->m_status_bits = 1;
  this->m_byte_count = OVar1 + sizeof_buffer;
  if (0xfffffff < sizeof_buffer) {
    do {
      Internal_Accumulate(this,(ON__UINT8 *)buffer,0xfffffff);
      sizeof_buffer = sizeof_buffer - 0xfffffff;
      buffer = (void *)((long)buffer + 0xfffffff);
    } while (0xfffffff < sizeof_buffer);
  }
  Internal_Accumulate(this,(ON__UINT8 *)buffer,(ON__UINT32)sizeof_buffer);
  return;
}

Assistant:

void ON_MD5::AccumulateBytes(
  const void* buffer,
  ON__UINT64 sizeof_buffer
  )
{
  if (nullptr != buffer && sizeof_buffer > 0)
  {
    if (1 != (1 & m_status_bits))
      Reset();
    m_status_bits = 1; // invalidate any intermediate cached m_digest value.
    m_byte_count += sizeof_buffer;
    const ON__UINT32 max_length = 0x0FFFFFFFU;
    const ON__UINT8* p = (const ON__UINT8*)buffer;
    while (sizeof_buffer > max_length)
    {
      Internal_Accumulate(p,max_length);
      sizeof_buffer -= max_length;
      p += max_length;
    }
    Internal_Accumulate(p,(ON__UINT32)sizeof_buffer);
  }
}